

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,SwitchInst *branch,bool param_2)

{
  bool bVar1;
  pointer pCVar2;
  BasicBlock *local_50;
  ConstantInt *local_48;
  __normal_iterator<const_LLVMBC::SwitchInst::Case_*,_std::vector<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>_>
  local_40;
  __normal_iterator<const_LLVMBC::SwitchInst::Case_*,_std::vector<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>_>
  local_38;
  const_iterator itr;
  Value *local_28;
  undefined1 local_19;
  SwitchInst *pSStack_18;
  bool param_2_local;
  SwitchInst *branch_local;
  StreamState *this_local;
  
  local_19 = param_2;
  pSStack_18 = branch;
  branch_local = (SwitchInst *)this;
  local_28 = SwitchInst::getCondition(branch);
  itr._M_current = (Case *)SwitchInst::getDefaultDest(pSStack_18);
  append<char_const(&)[8],LLVMBC::Value*,char_const(&)[3],LLVMBC::BasicBlock*>
            (this,(char (*) [8])"switch ",&local_28,(char (*) [3])", ",(BasicBlock **)&itr);
  begin_scope(this);
  local_38._M_current = (Case *)SwitchInst::case_begin(pSStack_18);
  while( true ) {
    local_40._M_current = (Case *)SwitchInst::case_end(pSStack_18);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    newline(this);
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_LLVMBC::SwitchInst::Case_*,_std::vector<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>_>
             ::operator->(&local_38);
    local_48 = SwitchInst::Case::getCaseValue(pCVar2);
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_LLVMBC::SwitchInst::Case_*,_std::vector<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>_>
             ::operator->(&local_38);
    local_50 = SwitchInst::Case::getCaseSuccessor(pCVar2);
    append<LLVMBC::ConstantInt*,char_const(&)[3],LLVMBC::BasicBlock*>
              (this,&local_48,(char (*) [3])", ",&local_50);
    __gnu_cxx::
    __normal_iterator<const_LLVMBC::SwitchInst::Case_*,_std::vector<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>_>
    ::operator++(&local_38);
  }
  end_scope(this);
  return;
}

Assistant:

void StreamState::append(SwitchInst *branch, bool)
{
	append("switch ", branch->getCondition(), ", ", branch->getDefaultDest());
	begin_scope();
	for (auto itr = branch->case_begin(); itr != branch->case_end(); ++itr)
	{
		newline();
		append(itr->getCaseValue(), ", ", itr->getCaseSuccessor());
	}
	end_scope();
}